

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# BumpAllocator.h
# Opt level: O0

ProductionSyntax * __thiscall
slang::BumpAllocator::
emplace<slang::syntax::ProductionSyntax,slang::syntax::DataTypeSyntax*&,slang::parsing::Token&,slang::syntax::FunctionPortListSyntax*&,slang::parsing::Token&,slang::syntax::SeparatedSyntaxList<slang::syntax::RsRuleSyntax>const&,slang::parsing::Token&>
          (BumpAllocator *this,DataTypeSyntax **args,Token *args_1,FunctionPortListSyntax **args_2,
          Token *args_3,SeparatedSyntaxList<slang::syntax::RsRuleSyntax> *args_4,Token *args_5)

{
  Token name;
  Token colon;
  Token semi;
  ProductionSyntax *this_00;
  SeparatedSyntaxList<slang::syntax::RsRuleSyntax> *args_local_4;
  Token *args_local_3;
  FunctionPortListSyntax **args_local_2;
  Token *args_local_1;
  DataTypeSyntax **args_local;
  BumpAllocator *this_local;
  
  this_00 = (ProductionSyntax *)allocate(this,0x80,8);
  name.kind = args_1->kind;
  name._2_1_ = args_1->field_0x2;
  name.numFlags.raw = (args_1->numFlags).raw;
  name.rawLen = args_1->rawLen;
  name.info = args_1->info;
  colon.kind = args_3->kind;
  colon._2_1_ = args_3->field_0x2;
  colon.numFlags.raw = (args_3->numFlags).raw;
  colon.rawLen = args_3->rawLen;
  colon.info = args_3->info;
  semi.kind = args_5->kind;
  semi._2_1_ = args_5->field_0x2;
  semi.numFlags.raw = (args_5->numFlags).raw;
  semi.rawLen = args_5->rawLen;
  semi.info = args_5->info;
  slang::syntax::ProductionSyntax::ProductionSyntax(this_00,*args,name,*args_2,colon,args_4,semi);
  return this_00;
}

Assistant:

T* emplace(Args&&... args) {
        static_assert(std::is_trivially_destructible_v<T>);
        return new (allocate(sizeof(T), alignof(T))) T(std::forward<Args>(args)...);
    }